

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.h
# Opt level: O2

void __thiscall CTxOut::CTxOut(CTxOut *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)((long)&(this->scriptPubKey).super_CScriptBase._union + 0x10) = 0;
  *(undefined8 *)((long)&(this->scriptPubKey).super_CScriptBase._union + 0x18) = 0;
  (this->scriptPubKey).super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  *(undefined8 *)((long)&(this->scriptPubKey).super_CScriptBase._union + 8) = 0;
  SetNull(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CTxOut()
    {
        SetNull();
    }